

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O2

ssize_t __thiscall LASindex::write(LASindex *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ssize_t sVar2;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  long *plVar3;
  char *fmt;
  U32 version;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  cVar1 = (**(code **)(*plVar3 + 8))(plVar3,"LASX",4);
  if (cVar1 == '\0') {
    fmt = "(LASindex): writing signature";
  }
  else {
    cVar1 = (**(code **)(*plVar3 + 0x18))(plVar3);
    if (cVar1 == '\0') {
      fmt = "(LASindex): writing version";
    }
    else {
      sVar2 = LASquadtree::write(this->spatial,__fd,__buf_00,__n);
      if ((char)sVar2 == '\0') {
        fmt = "(LASindex): cannot write LASspatial (LASquadtree)";
      }
      else {
        sVar2 = LASinterval::write(this->interval,__fd,__buf_01,__n);
        if ((char)sVar2 != '\0') {
          return CONCAT71((int7)((ulong)sVar2 >> 8),1);
        }
        fmt = "(LASindex): writing LASinterval";
      }
    }
  }
  laserror<>(fmt);
  return 0;
}

Assistant:

BOOL LASindex::write(ByteStreamOut* stream) const
{
  if (!stream->putBytes((const U8*)"LASX", 4))
  {
    laserror("(LASindex): writing signature");
    return FALSE;
  }
  U32 version = 0;
  if (!stream->put32bitsLE((const U8*)&version))
  {
    laserror("(LASindex): writing version");
    return FALSE;
  }
  // write spatial quadtree
  if (!spatial->write(stream))
  {
    laserror("(LASindex): cannot write LASspatial (LASquadtree)");
    return FALSE;
  }
  // write interval
  if (!interval->write(stream))
  {
    laserror("(LASindex): writing LASinterval");
    return FALSE;
  }
  return TRUE;
}